

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O1

size_t __thiscall
Common::SerialBijectionMap<ICM::Object_*>::_insert
          (SerialBijectionMap<ICM::Object_*> *this,Object **key)

{
  pointer *pppOVar1;
  iterator __position;
  mapped_type *pmVar2;
  mapped_type mVar3;
  
  pmVar2 = (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur == pmVar2) {
    mVar3 = this->currcount;
    pmVar2 = std::
             map<ICM::Object_*,_unsigned_long,_std::less<ICM::Object_*>,_std::allocator<std::pair<ICM::Object_*const,_unsigned_long>_>_>
             ::operator[](&this->keymap,key);
    *pmVar2 = mVar3;
    __position._M_current =
         (this->data).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->data).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ICM::Object*,std::allocator<ICM::Object*>>::_M_realloc_insert<ICM::Object*const&>
                ((vector<ICM::Object*,std::allocator<ICM::Object*>> *)&this->data,__position,key);
    }
    else {
      *__position._M_current = *key;
      pppOVar1 = &(this->data).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
    mVar3 = this->currcount;
    this->currcount = mVar3 + 1;
  }
  else {
    mVar3 = *pmVar2;
    pmVar2 = std::
             map<ICM::Object_*,_unsigned_long,_std::less<ICM::Object_*>,_std::allocator<std::pair<ICM::Object_*const,_unsigned_long>_>_>
             ::operator[](&this->keymap,key);
    *pmVar2 = mVar3;
    (this->data).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
    super__Vector_impl_data._M_start[mVar3] = *key;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&this->destroyable);
  }
  return mVar3;
}

Assistant:

size_t _insert(const _KTy &key) {
		if (destroyable.empty()) {
			keymap[key] = currcount;
			data.push_back(key);
			currcount++;
			return currcount - 1;
		}
		else {
			size_t id = destroyable.front();
			keymap[key] = id;
			data[id] = key;
			destroyable.pop_front();
			return id;
		}
	}